

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_add_sparse_entry(archive_read *a,tar *tar,int64_t offset,int64_t remaining)

{
  sparse_block *__s;
  sparse_block *p;
  int64_t remaining_local;
  int64_t offset_local;
  tar *tar_local;
  archive_read *a_local;
  
  __s = (sparse_block *)malloc(0x20);
  if (__s == (sparse_block *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    memset(__s,0,0x20);
    if (tar->sparse_last == (sparse_block *)0x0) {
      tar->sparse_list = __s;
    }
    else {
      tar->sparse_last->next = __s;
    }
    tar->sparse_last = __s;
    if ((remaining < 0) || (offset < 0)) {
      archive_set_error(&a->archive,-1,"Malformed sparse map data");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      __s->offset = offset;
      __s->remaining = remaining;
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
gnu_add_sparse_entry(struct archive_read *a, struct tar *tar,
    int64_t offset, int64_t remaining)
{
	struct sparse_block *p;

	p = (struct sparse_block *)malloc(sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	memset(p, 0, sizeof(*p));
	if (tar->sparse_last != NULL)
		tar->sparse_last->next = p;
	else
		tar->sparse_list = p;
	tar->sparse_last = p;
	if (remaining < 0 || offset < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC, "Malformed sparse map data");
		return (ARCHIVE_FATAL);
	}
	p->offset = offset;
	p->remaining = remaining;
	return (ARCHIVE_OK);
}